

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O0

int Test_SUNSparseMatrixToCSR(SUNMatrix A)

{
  int iVar1;
  undefined8 in_RDI;
  sunrealtype tol;
  SUNMatrix csr;
  SUNMatrix csc;
  int failure;
  sunrealtype in_stack_00000058;
  SUNMatrix in_stack_00000060;
  SUNMatrix in_stack_00000068;
  undefined8 local_28;
  undefined8 local_20;
  int local_14;
  int local_4;
  
  local_14 = SUNSparseMatrix_ToCSR(in_RDI,&local_28);
  if (local_14 == 0) {
    iVar1 = SUNSparseMatrix_ToCSC(local_28,&local_20);
    if (iVar1 == 0) {
      iVar1 = check_matrix(in_stack_00000068,in_stack_00000060,in_stack_00000058);
      if (iVar1 == 0) {
        printf("    PASSED test -- SUNSparseMatrixToCSR\n");
        SUNMatDestroy(local_28);
        SUNMatDestroy(local_20);
        local_4 = 0;
      }
      else {
        printf(">>> FAILED test --  Test_SUNSparseMatrixToCSR check_matrix failed\n");
        SUNMatDestroy(local_28);
        SUNMatDestroy(local_20);
        local_4 = 1;
      }
    }
    else {
      printf(">>> FAILED test -- SUNSparseMatrix_ToCSC returned nonzero\n");
      SUNMatDestroy(local_28);
      local_4 = 1;
    }
  }
  else {
    printf(">>> FAILED test -- SUNSparseMatrix_ToCSR returned nonzero\n");
    SUNMatDestroy(local_28);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNSparseMatrixToCSR(SUNMatrix A)
{
  int failure;
  SUNMatrix csc, csr;
  sunrealtype tol = 200 * SUN_UNIT_ROUNDOFF;

  failure = SUNSparseMatrix_ToCSR(A, &csr);

  if (failure)
  {
    printf(">>> FAILED test -- SUNSparseMatrix_ToCSR returned nonzero\n");
    SUNMatDestroy(csr);
    return (1);
  }

  /* check entries */
  if (SUNSparseMatrix_ToCSC(csr, &csc))
  {
    printf(">>> FAILED test -- SUNSparseMatrix_ToCSC returned nonzero\n");
    SUNMatDestroy(csr);
    return (1);
  }

  if (check_matrix(A, csc, tol))
  {
    printf(
      ">>> FAILED test --  Test_SUNSparseMatrixToCSR check_matrix failed\n");
    SUNMatDestroy(csr);
    SUNMatDestroy(csc);
    return (1);
  }

  printf("    PASSED test -- SUNSparseMatrixToCSR\n");

  SUNMatDestroy(csr);
  SUNMatDestroy(csc);

  return (0);
}